

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

BranchReloc * __thiscall
IRBuilder::AddBranchInstr
          (IRBuilder *this,BranchInstr *branchInstr,uint32 offset,uint32 targetOffset)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar4;
  Instr *instr;
  JITLoopHeaderIDL *pJVar5;
  BranchReloc *pBVar6;
  uint offset_00;
  
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  uVar3 = JITTimeFunctionBody::GetByteCodeLength(this_00);
  if (uVar3 < targetOffset) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1d4a,"(targetOffset <= m_func->GetJITFunctionBody()->GetByteCodeLength())"
                       ,"targetOffset <= m_func->GetJITFunctionBody()->GetByteCodeLength()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar2 = IsLoopBodyOuterOffset(this,targetOffset);
  if (bVar2) {
    bVar2 = IsLoopBodyReturnIPInstr(this,this->m_lastInstr);
    if (!bVar2) {
      instr = CreateLoopBodyReturnIPInstr(this,targetOffset,offset_00);
      AddInstr(this,instr,offset);
    }
    pJVar5 = JITTimeWorkItem::GetLoopHeader(this->m_func->m_workItem);
    targetOffset = pJVar5->endOffset + 1;
  }
  pBVar6 = CreateRelocRecord(this,branchInstr,offset,targetOffset);
  AddInstr(this,&branchInstr->super_Instr,offset);
  return pBVar6;
}

Assistant:

BranchReloc *
IRBuilder::AddBranchInstr(IR::BranchInstr * branchInstr, uint32 offset, uint32 targetOffset)
{
    AssertOrFailFast(targetOffset <= m_func->GetJITFunctionBody()->GetByteCodeLength());
    //
    // Loop jitting would be done only till the LoopEnd
    // Any branches beyond that offset are for the return stmt
    //
    if (IsLoopBodyOuterOffset(targetOffset))
    {
        // if we have loaded the loop IP sym from the ProfiledLoopEnd then don't add it here
        if (!IsLoopBodyReturnIPInstr(m_lastInstr))
        {
            this->InsertLoopBodyReturnIPInstr(targetOffset, offset);
        }

        // Jump the restore StSlot and Ret instruction
        targetOffset = GetLoopBodyExitInstrOffset();
    }

    BranchReloc *  reloc = nullptr;
    reloc = this->CreateRelocRecord(branchInstr, offset, targetOffset);

    this->AddInstr(branchInstr, offset);
    return reloc;
}